

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_0::PartialResponseNoThrowService::PartialResponseNoThrowService
          (PartialResponseNoThrowService *this)

{
  PartialResponseNoThrowService *this_local;
  
  HttpService::HttpService(&this->super_HttpService);
  (this->super_HttpService)._vptr_HttpService = (_func_int **)&PTR_request_007cf7a0;
  Maybe<kj::Exception>::Maybe(&this->exception);
  HttpHeaderTable::HttpHeaderTable(&this->table);
  return;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& response) override {
    return requestBody.readAllBytes()
        .then([this,&response](kj::Array<byte>&&) -> kj::Promise<void> {
      HttpHeaders headers(table);
      auto body = response.send(200, "OK", headers, 32);
      auto promise = body->write("foo", 3);
      return promise.attach(kj::mv(body));
    });
  }